

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_is_link(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  void *pvVar2;
  char *pcVar3;
  int rc;
  jx9_vfs *pVfs;
  char *zPath;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pCtx,0);
    return 0;
  }
  pvVar2 = jx9_context_user_data(pCtx);
  if ((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 200) != 0)) {
    pcVar3 = jx9_value_to_string(*apArg,(int *)0x0);
    iVar1 = (**(code **)((long)pvVar2 + 200))(pcVar3);
    jx9_result_bool(pCtx,(uint)(iVar1 == 0));
    return 0;
  }
  pcVar3 = jx9_function_name(pCtx);
  jx9_context_throw_error_format
            (pCtx,2,"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
             pcVar3);
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Vfs_is_link(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zPath;
	jx9_vfs *pVfs;
	int rc;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xIslink == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the desired directory */
	zPath = jx9_value_to_string(apArg[0], 0);
	/* Perform the requested operation */
	rc = pVfs->xIslink(zPath);
	/* IO return value */
	jx9_result_bool(pCtx, rc == JX9_OK);
	return JX9_OK;
}